

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O0

_Bool object_curses_find_flags(player *p,object *obj,bitflag *test_flags)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t local_90;
  bitflag local_89;
  wchar_t flag;
  wchar_t wStack_84;
  bitflag f [5];
  wchar_t index;
  wchar_t i;
  _Bool new;
  char o_name [80];
  bitflag *test_flags_local;
  object *obj_local;
  player *p_local;
  
  index._3_1_ = false;
  object_desc((char *)&i,0x50,obj,0,p);
  if (obj->curses != (curse_data *)0x0) {
    f[1] = '\x01';
    f[2] = '\0';
    f[3] = '\0';
    f[4] = '\0';
    for (; (int)f._1_4_ < (int)(uint)z_info->curse_max; f._1_4_ = f._1_4_ + 1) {
      if ((obj->curses[(int)f._1_4_].power != L'\0') && (curses[(int)f._1_4_].obj != (object *)0x0))
      {
        object_flags(curses[(int)f._1_4_].obj,&local_89);
        flag_inter(&local_89,test_flags,5);
        for (local_90 = flag_next(&local_89,5,1); local_90 != L'\0';
            local_90 = flag_next(&local_89,5,local_90 + L'\x01')) {
          _Var1 = flag_has_dbg(p->obj_k->flags,5,local_90,"p->obj_k->flags","flag");
          if (!_Var1) {
            index._3_1_ = true;
            wVar2 = rune_index(6,local_90);
            player_learn_rune(p,(long)wVar2,true);
            if ((p->upkeep->playing & 1U) != 0) {
              flag_message(local_90,(char *)&i);
            }
          }
          wStack_84 = rune_index(5,f._1_4_);
          if (L'\xffffffff' < wStack_84) {
            player_learn_rune(p,(long)wStack_84,true);
          }
        }
      }
    }
  }
  return index._3_1_;
}

Assistant:

static bool object_curses_find_flags(struct player *p, struct object *obj,
							  bitflag *test_flags)
{
	char o_name[80];
	bool new = false;

	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, p);
	if (obj->curses) {
		int i;
		int index;
		bitflag f[OF_SIZE];
		int flag;

		for (i = 1; i < z_info->curse_max; i++) {
			if (!obj->curses[i].power || !curses[i].obj)
				continue;

			/* Get all the relevant flags */
			object_flags(curses[i].obj, f);
			of_inter(f, test_flags);
			for (flag = of_next(f, FLAG_START); flag != FLAG_END;
				 flag = of_next(f, flag + 1)) {
				/* Learn any new flags */
				if (!of_has(p->obj_k->flags, flag)) {
					new = true;
					player_learn_rune(p, rune_index(RUNE_VAR_FLAG, flag), true);
					if (p->upkeep->playing) {
						flag_message(flag, o_name);
					}
				}

				/* Learn the curse */
				index = rune_index(RUNE_VAR_CURSE, i);
				if (index >= 0) {
					player_learn_rune(p, index, true);
				}
			}
		}
	}

	return new;
}